

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltalloc.cc
# Opt level: O3

void * sys_aligned_alloc(size_t alignment,size_t size)

{
  void *pvVar1;
  size_t __len;
  void *__addr;
  size_t __len_00;
  
  pvVar1 = mmap((void *)0x0,alignment,3,0x22,-1,0);
  __addr = (void *)((long)pvVar1 + 1U & 0xfffffffffffffffe);
  if (((long)pvVar1 + 1U & 0xfffe) != 0) {
    munmap(__addr,alignment);
    if (page_size()::pagesize == 0) {
      page_size()::pagesize = sysconf(0x1e);
    }
    __addr = (void *)0x0;
    pvVar1 = mmap((void *)0x0,(alignment + 0x10000) - page_size()::pagesize,3,0x22,-1,0);
    pvVar1 = (void *)((long)pvVar1 + 1U & 0xfffffffffffffffe);
    if (pvVar1 != (void *)0x0) {
      __addr = (void *)((long)pvVar1 + 0xffffU & 0xffffffffffff0000);
      __len_00 = (long)__addr - (long)pvVar1;
      if (__len_00 != 0) {
        munmap(pvVar1,__len_00);
      }
      if (page_size()::pagesize == 0) {
        page_size()::pagesize = sysconf(0x1e);
      }
      __len = 0x10000 - (page_size()::pagesize + __len_00);
      if ((long)__len < 0) {
        __assert_fail("(intptr_t)diff >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/ktnr[P]TwoStepBranchingProcedure/external/ltalloc/ltalloc.cc"
                      ,0x193,"void *sys_aligned_alloc(size_t, size_t)");
      }
      if (page_size()::pagesize + __len_00 != 0x10000) {
        munmap((void *)(alignment + (long)__addr),__len);
      }
    }
  }
  return __addr;
}

Assistant:

static void* sys_aligned_alloc(size_t alignment, size_t size)
{
	void* p = LTALLOC_VMALLOC(size);//optimistically try mapping precisely the right amount before falling back to the slow method
	LTALLOC_ASSERT(!(alignment & (alignment - 1)) && "alignment must be a power of two");
	if ((uintptr_t)p & (alignment - 1))
	{
		LTALLOC_VMFREE(p, size);
		p = LTALLOC_VMALLOC(size + alignment - LTALLOC_VMALLOC_MIN_SIZE());
		if (p)
		{
			uintptr_t ap = ((uintptr_t)p + (alignment - 1)) & ~(alignment - 1);
			uintptr_t diff = ap - (uintptr_t)p;
			if (diff) LTALLOC_VMFREE(p, diff);
			diff = alignment - LTALLOC_VMALLOC_MIN_SIZE() - diff;
			LTALLOC_ASSERT((intptr_t)diff >= 0);
			if (diff) LTALLOC_VMFREE((void*)(ap + size), diff);
			return (void*)ap;
		}
	}

	return p;
}